

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myexpand.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  FILE *__stream;
  size_t __size;
  char *__ptr;
  long lVar2;
  
  name = *argv;
  lVar2 = 8;
  while( true ) {
    iVar1 = __posix_getopt(argc,argv,"t:");
    if (iVar1 != 0x74) break;
    lVar2 = strtol(_optarg,(char **)0x0,10);
  }
  if (iVar1 == -1) {
    iVar1 = (int)lVar2;
    if (0 < iVar1) {
      lVar2 = (long)_optind;
      if (_optind == argc) {
        read_file(_stdin,iVar1);
      }
      else if (_optind < argc) {
        do {
          __stream = fopen(argv[lVar2],"r");
          if (__stream == (FILE *)0x0) {
            fprintf(_stderr,"%s ERROR:\t",name);
            __ptr = "unable to open file";
            __size = 0x13;
            goto LAB_001012a9;
          }
          read_file((FILE *)__stream,iVar1);
          fclose(__stream);
          lVar2 = lVar2 + 1;
        } while (argc != lVar2);
      }
      exit(0);
    }
    fprintf(_stderr,"%s ERROR:\t",name);
    __ptr = "value of -t is invalid";
    __size = 0x16;
LAB_001012a9:
    fwrite(__ptr,__size,1,_stderr);
    fputc(10,_stderr);
  }
  else {
    fprintf(_stdout,"USAGE: %s [-t tabstop] [file...]",name);
  }
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{

	name = argv[0];

	int tabstop = 8;
	int opt;
	while ((opt = getopt(argc, argv, "t:")) != -1)
	{
		switch (opt)
		{
		case 't':
			tabstop = (int)strtol(optarg, (char **)NULL, 10);
			break;
		default:
			USAGE();
		}
	}

	if (tabstop <= 0)
	{
		ERROR_EXIT("value of -t is invalid");
	}

	if (optind == argc)
	{
		read_file(stdin, tabstop);
		exit(EXIT_SUCCESS);
	}
	else
	{
		for (int i = optind; i < argc; i++)
		{
			FILE *input = fopen(argv[i], "r");
			if (input == NULL)
			{
				ERROR_EXIT("unable to open file");
			}
			read_file(input, tabstop);
			fclose(input);
		}
		exit(EXIT_SUCCESS);
	}
}